

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

type __thiscall
fmt::v5::internal::
arg_formatter_base<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
::operator()(arg_formatter_base<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
             *this,longdouble value)

{
  undefined8 *puVar1;
  format_specs local_28;
  
  puVar1 = *(undefined8 **)(this + 0x10);
  if (puVar1 == (undefined8 *)0x0) {
    local_28.super_align_spec.width_ = 0;
    local_28.super_align_spec.fill_ = L' ';
    local_28._8_5_ = 0;
    local_28.flags_._1_3_ = 0;
    local_28.precision_ = -1;
    local_28.type_ = '\0';
  }
  else {
    local_28.precision_ = (int)((ulong)*(undefined8 *)((long)puVar1 + 0xd) >> 0x18);
    local_28.type_ = (char)((ulong)*(undefined8 *)((long)puVar1 + 0xd) >> 0x38);
    local_28.super_align_spec._0_8_ = *puVar1;
    local_28._8_5_ = SUB85(puVar1[1],0);
    local_28.flags_._1_3_ = (undefined3)((ulong)puVar1[1] >> 0x28);
  }
  basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  ::write_double<long_double>
            ((basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
              *)this,value,&local_28);
  return (type)*(basic_buffer<char> **)this;
}

Assistant:

typename std::enable_if<std::is_floating_point<T>::value, iterator>::type
      operator()(T value) {
    writer_.write_double(value, specs_ ? *specs_ : format_specs());
    return out();
  }